

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Mahony_update(quaternion *q)

{
  initializer_list<float> list;
  initializer_list<float> list_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  quaternion local_300;
  quaternion local_2e8;
  quaternion local_2d0;
  quaternion local_2b8;
  quaternion local_2a0;
  matrix<3UL,_1UL> local_288;
  matrix<3UL,_1UL> local_270;
  vector<3UL> local_258;
  vector<3UL> local_240;
  vector<3UL> local_228;
  undefined1 local_210 [8];
  vector<3UL> gyr;
  matrix<3UL,_1UL> local_1e0;
  matrix<3UL,_1UL> local_1c8;
  undefined1 local_1b0 [8];
  vector<3UL> error;
  quaternion local_178;
  quaternion local_160;
  undefined1 local_148 [8];
  vector<3UL> mag_expect;
  float mag_v;
  float mag_h;
  quaternion local_110;
  undefined1 local_f8 [8];
  vector<3UL> mag_0;
  undefined1 local_c8 [8];
  vector<3UL> mag;
  quaternion local_90;
  quaternion local_78;
  undefined1 local_60 [8];
  vector<3UL> acc_expect;
  undefined1 local_30 [8];
  vector<3UL> acc;
  float Ki;
  float Kp;
  quaternion *q_local;
  
  acc.super_matrix<3UL,_1UL>._20_4_ = 0x42f00000;
  acc.super_matrix<3UL,_1UL>.data[2][0] = 0.02;
  physical_model::accelerometer();
  blas::vector<3UL>::normalized
            ((vector<3UL> *)local_30,(vector<3UL> *)(acc_expect.super_matrix<3UL,_1UL>.data + 2));
  mag.super_matrix<3UL,_1UL>._20_4_ = 0;
  list_00._M_len = 3;
  list_00._M_array = (iterator)&mag.super_matrix<3UL,_1UL>.field_0x14;
  blas::quaternion::quaternion(&local_90,list_00);
  blas::quaternion::rotate_inv(&local_78,q,&local_90);
  blas::vector<3UL>::vector((vector<3UL> *)local_60,&local_78);
  physical_model::magnetometer();
  blas::vector<3UL>::normalized
            ((vector<3UL> *)local_c8,(vector<3UL> *)(mag_0.super_matrix<3UL,_1UL>.data + 2));
  blas::quaternion::quaternion((quaternion *)&mag_v,(vector<3UL> *)local_c8);
  blas::quaternion::rotate(&local_110,q,(quaternion *)&mag_v);
  blas::vector<3UL>::vector((vector<3UL> *)local_f8,&local_110);
  fVar1 = blas::vector<3UL>::operator()((vector<3UL> *)local_f8,0);
  fVar2 = blas::vector<3UL>::operator()((vector<3UL> *)local_f8,0);
  fVar3 = blas::vector<3UL>::operator()((vector<3UL> *)local_f8,1);
  fVar4 = blas::vector<3UL>::operator()((vector<3UL> *)local_f8,1);
  mag_expect.super_matrix<3UL,_1UL>._20_4_ = sqrtf(fVar1 * fVar2 + fVar3 * fVar4);
  mag_expect.super_matrix<3UL,_1UL>.data[2][0] =
       blas::vector<3UL>::operator()((vector<3UL> *)local_f8,2);
  error.super_matrix<3UL,_1UL>._20_4_ = mag_expect.super_matrix<3UL,_1UL>._20_4_;
  list._M_len = 3;
  list._M_array = (iterator)&error.super_matrix<3UL,_1UL>.field_0x14;
  blas::quaternion::quaternion(&local_178,list);
  blas::quaternion::rotate_inv(&local_160,q,&local_178);
  blas::vector<3UL>::vector((vector<3UL> *)local_148,&local_160);
  blas::vector<3UL>::cross
            ((vector<3UL> *)&local_1e0,(vector<3UL> *)local_30,(vector<3UL> *)local_60);
  blas::vector<3UL>::cross
            ((vector<3UL> *)(gyr.super_matrix<3UL,_1UL>.data + 2),(vector<3UL> *)local_c8,
             (vector<3UL> *)local_148);
  blas::matrix<3UL,_1UL>::operator+
            (&local_1c8,&local_1e0,(matrix<3UL,_1UL> *)(gyr.super_matrix<3UL,_1UL>.data + 2));
  blas::vector<3UL>::vector((vector<3UL> *)local_1b0,&local_1c8);
  physical_model::gyroscope();
  blas::operator*(&local_240,0.02,(vector<3UL> *)local_1b0);
  blas::vector<3UL>::operator*(&local_228,&local_240,0.01);
  blas::vector<3UL>::operator+=(&Mahony_update::integrated_error,&local_228);
  blas::operator*((vector<3UL> *)&local_288,120.0,(vector<3UL> *)local_1b0);
  blas::matrix<3UL,_1UL>::operator+
            (&local_270,&Mahony_update::integrated_error.super_matrix<3UL,_1UL>,&local_288);
  blas::vector<3UL>::vector(&local_258,&local_270);
  blas::vector<3UL>::operator+=((vector<3UL> *)local_210,&local_258);
  blas::operator*(&local_2d0,0.5,q);
  blas::quaternion::quaternion(&local_2e8,(vector<3UL> *)local_210);
  blas::quaternion::operator*(&local_2b8,&local_2d0,&local_2e8);
  blas::quaternion::operator*(&local_2a0,&local_2b8,0.01);
  blas::quaternion::operator+=(q,&local_2a0);
  blas::quaternion::normalized(&local_300,q);
  blas::quaternion::operator=(q,&local_300);
  return;
}

Assistant:

void Mahony_update(blas::quaternion &q) {
    using blas::quaternion;
    using blas::vector;
    using blas::matrix;

    const float Kp = 120.0, Ki = 0.02;
    static vector<3> integrated_error;

    const vector<3> acc = physical_model::accelerometer().normalized();
    // Assume the real acceleration is pointing to z+,
    // i.e. there is no accelerated motion.
    const vector<3> acc_expect = q.rotate_inv({0, 0, 1});

    const vector<3> mag = physical_model::magnetometer().normalized();
    const vector<3> mag_0 = q.rotate(mag);
    // Decompose into x-y plane(horizontal) and z-axis(vertical).
    const float mag_h = sqrtf(mag_0(0) * mag_0(0) + mag_0(1) * mag_0(1));
    const float mag_v = mag_0(2);
    // Assume the real direction of magnetic field is in surface y=0, pointing to x+,
    // i.e. there is no electromagnetic interference.
    const vector<3> mag_expect = q.rotate_inv({mag_h, 0, mag_v});

    const vector<3> error = acc.cross(acc_expect) + mag.cross(mag_expect);

    vector<3> gyr = physical_model::gyroscope();
    integrated_error += Ki * error * duration;
    gyr += integrated_error + Kp * error;

    // Approximate the integral
    q += 0.5 * q * gyr * duration;
    q = q.normalized();
}